

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

int x86CPUInfo(CPUFeature feature)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int in_EDI;
  bool bVar4;
  int VENDOR_ID_INTEL_ECX;
  int VENDOR_ID_INTEL_EDX;
  int VENDOR_ID_INTEL_EBX;
  int is_intel;
  int cpu_info [4];
  int max_cpuid_value;
  int local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  CPUFeature in_stack_fffffffffffffff0;
  uint local_4;
  
  GetCPUInfo(&local_28,0);
  iVar1 = local_28;
  if (local_28 < 1) {
    local_4 = 0;
  }
  else {
    bVar4 = false;
    if ((local_24 == 0x756e6547) && (bVar4 = false, local_20 == 0x6c65746e)) {
      bVar4 = local_1c == 0x49656e69;
    }
    GetCPUInfo(&local_28,1);
    if (in_EDI == 0) {
      local_4 = (uint)((local_1c & 0x4000000) != 0);
    }
    else if (in_EDI == 1) {
      local_4 = (uint)((local_20 & 1) != 0);
    }
    else if (in_EDI == 2) {
      if ((bVar4) && ((local_20 & 0x200) != 0)) {
        local_4 = CheckSlowModel(local_28);
      }
      else {
        local_4 = 0;
      }
    }
    else if (in_EDI == 3) {
      local_4 = (uint)((local_20 & 0x80000) != 0);
    }
    else if ((in_EDI == 4) && ((local_20 & 0x18000000) == 0x18000000)) {
      uVar3 = xgetbv();
      local_4 = (uint)((uVar3 & 6) == 6);
    }
    else if (((in_EDI == 5) && (iVar2 = x86CPUInfo(in_stack_fffffffffffffff0), iVar2 != 0)) &&
            (6 < iVar1)) {
      GetCPUInfo(&local_28,7);
      local_4 = (uint)((local_24 & 0x20) != 0);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int x86CPUInfo(CPUFeature feature) {
  int max_cpuid_value;
  int cpu_info[4];
  int is_intel = 0;

  // get the highest feature value cpuid supports
  GetCPUInfo(cpu_info, 0);
  max_cpuid_value = cpu_info[0];
  if (max_cpuid_value < 1) {
    return 0;
  } else {
    const int VENDOR_ID_INTEL_EBX = 0x756e6547;  // uneG
    const int VENDOR_ID_INTEL_EDX = 0x49656e69;  // Ieni
    const int VENDOR_ID_INTEL_ECX = 0x6c65746e;  // letn
    is_intel = (cpu_info[1] == VENDOR_ID_INTEL_EBX &&
                cpu_info[2] == VENDOR_ID_INTEL_ECX &&
                cpu_info[3] == VENDOR_ID_INTEL_EDX);    // genuine Intel?
  }

  GetCPUInfo(cpu_info, 1);
  if (feature == kSSE2) {
    return !!(cpu_info[3] & (1 << 26));
  }
  if (feature == kSSE3) {
    return !!(cpu_info[2] & (1 << 0));
  }
  if (feature == kSlowSSSE3) {
    if (is_intel && (cpu_info[2] & (1 << 9))) {   // SSSE3?
      return CheckSlowModel(cpu_info[0]);
    }
    return 0;
  }

  if (feature == kSSE4_1) {
    return !!(cpu_info[2] & (1 << 19));
  }
  if (feature == kAVX) {
    // bits 27 (OSXSAVE) & 28 (256-bit AVX)
    if ((cpu_info[2] & 0x18000000) == 0x18000000) {
      // XMM state and YMM state enabled by the OS.
      return (xgetbv() & 0x6) == 0x6;
    }
  }
  if (feature == kAVX2) {
    if (x86CPUInfo(kAVX) && max_cpuid_value >= 7) {
      GetCPUInfo(cpu_info, 7);
      return !!(cpu_info[1] & (1 << 5));
    }
  }
  return 0;
}